

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whisper.cpp
# Opt level: O1

void whisper_batch_prep_legacy
               (whisper_batch *batch,whisper_token *tokens,int n_tokens,int n_past,int seq_id)

{
  ulong uVar1;
  
  batch->n_tokens = n_tokens;
  if (0 < n_tokens) {
    uVar1 = 0;
    do {
      if (tokens != (whisper_token *)0x0) {
        batch->token[uVar1] = tokens[uVar1];
      }
      batch->pos[uVar1] = n_past + (int)uVar1;
      batch->n_seq_id[uVar1] = 1;
      *batch->seq_id[uVar1] = 0;
      batch->logits[uVar1] = '\0';
      uVar1 = uVar1 + 1;
    } while ((uint)n_tokens != uVar1);
  }
  batch->logits[(long)n_tokens + -1] = '\x01';
  return;
}

Assistant:

static void whisper_batch_prep_legacy(whisper_batch & batch, const whisper_token * tokens, int n_tokens, int n_past, int seq_id) {
    batch.n_tokens = n_tokens;
    for (int i = 0; i < n_tokens; ++i) {
        if (tokens) {
            batch.token[i] = tokens[i];
        }
        batch.pos     [i]    = n_past + i;
        batch.n_seq_id[i]    = 1;
        batch.seq_id  [i][0] = seq_id;
        batch.logits  [i]    = 0;
    }
    batch.logits[n_tokens - 1] = 1;
}